

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManExplore2(Sbd_Man_t *p,int Pivot,word *pTruth)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  FILE *pFile;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int nCol;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  sat_solver *psVar8;
  abctime aVar9;
  word wVar10;
  uint local_898;
  uint local_894;
  int local_874;
  uint local_870;
  int i_1;
  int RetValue;
  int nConsts;
  int nDivs;
  int FreeVar;
  int PivotVar;
  int nRows;
  int k;
  int i;
  int nItersMax;
  int nIters;
  word CoverCols [64];
  word CoverRows [64];
  word Cube;
  word Offset [64];
  word Onset [64];
  abctime clk;
  word *pTruth_local;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  memset(Offset + 0x3f,0,0x200);
  memset(&Cube,0,0x200);
  memset(CoverCols + 0x3f,0,0x200);
  memset(&nItersMax,0,0x200);
  iVar1 = Vec_IntEntry(p->vObj2Var,Pivot);
  iVar2 = Vec_IntSize(p->vWinObjs);
  iVar3 = Vec_IntSize(p->vTfo);
  iVar4 = Vec_IntSize(p->vRoots);
  nCol = Vec_IntSize(p->vDivVars);
  aVar7 = Abc_Clock();
  psVar8 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar8;
  aVar9 = Abc_Clock();
  p->timeCnf = (aVar9 - aVar7) + p->timeCnf;
  aVar7 = Abc_Clock();
  p_local._4_4_ = Sbd_ManCollectConstantsNew(p->pSat,p->vDivVars,4,iVar1,Offset + 0x3f,&Cube);
  aVar9 = Abc_Clock();
  p->timeSat = (aVar9 - aVar7) + p->timeSat;
  if ((int)p_local._4_4_ < 0) {
    local_870 = 0;
    FreeVar = 0;
    for (nRows = 0; nRows < 4; nRows = nRows + 1) {
      for (PivotVar = 0; PivotVar < 4; PivotVar = PivotVar + 1) {
        if ((Offset[(long)nRows + 0x3f] ^ Offset[(long)PivotVar + -1]) == 0) {
          __assert_fail("Cube",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x4b9,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
        }
        FreeVar = Sbd_ManAddCube1(0x100,CoverCols + 0x3f,FreeVar,
                                  Offset[(long)nRows + 0x3f] ^ Offset[(long)PivotVar + -1]);
      }
    }
    if (0x40 < FreeVar) {
      __assert_fail("nRows <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x4bc,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
    }
    for (nRows = 0; nRows < FreeVar; nRows = nRows + 1) {
      for (PivotVar = 0; PivotVar <= nCol; PivotVar = PivotVar + 1) {
        if ((CoverCols[(long)nRows + 0x3f] >> ((byte)PivotVar & 0x3f) & 1) != 0) {
          Abc_TtXorBit((word *)(&nItersMax + (long)PivotVar * 2),nRows);
        }
      }
    }
    for (i = 0; i < 0x20 && FreeVar < 0x40; i = i + 1) {
      if (p->pPars->fVeryVerbose != 0) {
        Sbd_ManMatrPrint(p,(word *)&nItersMax,nCol,FreeVar);
      }
      aVar7 = Abc_Clock();
      iVar5 = Sbd_ManFindCands(p,(word *)&nItersMax,nCol);
      if (iVar5 == 0) {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Cannot find a feasible cover.\n");
        }
        aVar9 = Abc_Clock();
        p->timeCov = (aVar9 - aVar7) + p->timeCov;
        return 0;
      }
      aVar9 = Abc_Clock();
      p->timeCov = (aVar9 - aVar7) + p->timeCov;
      if (p->pPars->fVeryVerbose != 0) {
        printf("Candidate support:  ");
        Vec_IntPrint(p->vDivSet);
      }
      aVar7 = Abc_Clock();
      wVar10 = Sbd_ManSolve(p->pSat,iVar1,iVar2 + iVar3 + iVar4 + i,p->vDivSet,p->vDivVars,
                            p->vDivValues,p->vLits);
      *pTruth = wVar10;
      aVar9 = Abc_Clock();
      p->timeSat = (aVar9 - aVar7) + p->timeSat;
      if (*pTruth == 0x1234567812345678) {
        printf("Node %d:  Undecided.\n",(ulong)(uint)Pivot);
      }
      else {
        if (*pTruth != 0x8765432187654321) {
          if (p->pPars->fVeryVerbose != 0) {
            printf("Node %d:  UNSAT.   ",(ulong)(uint)Pivot);
            pFile = _stdout;
            iVar1 = Vec_IntSize(p->vDivSet);
            Extra_PrintBinary(pFile,(uint *)pTruth,1 << ((byte)iVar1 & 0x1f));
            printf("\n");
          }
          p->nLuts[1] = p->nLuts[1] + 1;
          local_870 = 1;
          break;
        }
        if (p->pPars->fVeryVerbose != 0) {
          printf("Node %d:  SAT.\n",(ulong)(uint)Pivot);
          for (local_874 = 0; local_874 < nCol; local_874 = local_874 + 1) {
            p_00 = p->vLutLevs;
            p_01 = p->vWinObjs;
            iVar5 = Vec_IntEntry(p->vDivVars,local_874);
            iVar5 = Vec_IntEntry(p_01,iVar5);
            uVar6 = Vec_IntEntry(p_00,iVar5);
            printf("%d",(ulong)uVar6);
          }
          printf("\n");
          for (local_874 = 0; local_874 < nCol; local_874 = local_874 + 1) {
            printf("%d",(long)local_874 % 10 & 0xffffffff);
          }
          printf("\n");
          for (local_874 = 0; local_874 < nCol; local_874 = local_874 + 1) {
            uVar6 = Vec_IntEntry(p->vDivValues,local_874);
            if ((uVar6 & 4) == 0) {
              local_894 = 0x78;
            }
            else {
              uVar6 = Vec_IntEntry(p->vDivValues,local_874);
              local_894 = (uVar6 & 1) + 0x30;
            }
            printf("%c",(ulong)local_894);
          }
          printf("\n");
          for (local_874 = 0; local_874 < nCol; local_874 = local_874 + 1) {
            uVar6 = Vec_IntEntry(p->vDivValues,local_874);
            if ((uVar6 & 8) == 0) {
              local_898 = 0x78;
            }
            else {
              iVar5 = Vec_IntEntry(p->vDivValues,local_874);
              local_898 = (iVar5 >> 1 & 1U) + 0x30;
            }
            printf("%c",(ulong)local_898);
          }
          printf("\n");
        }
        for (nRows = 0; nRows < nCol; nRows = nRows + 1) {
          iVar5 = Vec_IntEntry(p->vDivValues,nRows);
          if ((iVar5 == 0xe) || (iVar5 = Vec_IntEntry(p->vDivValues,nRows), iVar5 == 0xd)) {
            *(ulong *)(&nItersMax + (long)nRows * 2) =
                 1L << ((byte)FreeVar & 0x3f) | *(ulong *)(&nItersMax + (long)nRows * 2);
          }
        }
        *(ulong *)(&nItersMax + (long)nCol * 2) =
             1L << ((byte)FreeVar & 0x3f) | *(ulong *)(&nItersMax + (long)nCol * 2);
        FreeVar = FreeVar + 1;
      }
    }
    p_local._4_4_ = local_870;
  }
  else {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)p_local._4_4_,(ulong)(uint)Pivot);
    }
    Vec_IntWriteEntry(p->vLutLevs,Pivot,0);
    p->nLuts[0] = p->nLuts[0] + 1;
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManExplore2( Sbd_Man_t * p, int Pivot, word * pTruth )
{
    abctime clk;
    word Onset[64] = {0}, Offset[64] = {0}, Cube;
    word CoverRows[64] = {0}, CoverCols[64] = {0};
    int nIters, nItersMax = 32;
    int i, k, nRows = 0;

    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(p->vWinObjs) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots);
    int nDivs = Vec_IntSize( p->vDivVars );
    int nConsts = 4;
    int RetValue;

    clk = Abc_Clock();
    //sat_solver_delete_p( &p->pSat );
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;

    assert( nConsts <= 8 );
    clk = Abc_Clock();
    RetValue = Sbd_ManCollectConstantsNew( p->pSat, p->vDivVars, nConsts, PivotVar, Onset, Offset );
    p->timeSat += Abc_Clock() - clk;
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    RetValue = 0;

    // create rows of the table
    nRows = 0;
    for ( i = 0; i < nConsts; i++ )
    for ( k = 0; k < nConsts; k++ )
    {
        Cube = Onset[i] ^ Offset[k];
        assert( Cube );
        nRows = Sbd_ManAddCube1( 256, CoverRows, nRows, Cube );
    }
    assert( nRows <= 64 );
    
    // create columns of the table
    for ( i = 0; i < nRows; i++ )
        for ( k = 0; k <= nDivs; k++ )
            if ( (CoverRows[i] >> k) & 1 )
                Abc_TtXorBit(&CoverCols[k], i);

    // solve the covering problem
    for ( nIters = 0; nIters < nItersMax && nRows < 64; nIters++ )
    {
        if ( p->pPars->fVeryVerbose )
            Sbd_ManMatrPrint( p, CoverCols, nDivs, nRows );

        clk = Abc_Clock();
        if ( !Sbd_ManFindCands( p, CoverCols, nDivs ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Cannot find a feasible cover.\n" );
            p->timeCov += Abc_Clock() - clk;
            return 0;
        }
        p->timeCov += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
            printf( "Candidate support:  " ),
            Vec_IntPrint( p->vDivSet );

        clk = Abc_Clock();
        *pTruth = Sbd_ManSolve( p->pSat, PivotVar, FreeVar+nIters, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;

        if ( *pTruth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( *pTruth == SBD_SAT_SAT )
        {
            if ( p->pPars->fVeryVerbose )
            {
                int i;
                printf( "Node %d:  SAT.\n", Pivot );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", i % 10 );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x4) ? '0' + (Vec_IntEntry(p->vDivValues, i) & 1) : 'x' );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x8) ? '0' + ((Vec_IntEntry(p->vDivValues, i) >> 1) & 1) : 'x' );
                printf( "\n" );
            }
            // add row to the covering table
            for ( i = 0; i < nDivs; i++ )
                if ( Vec_IntEntry(p->vDivValues, i) == 0xE || Vec_IntEntry(p->vDivValues, i) == 0xD )
                    CoverCols[i] |= ((word)1 << nRows);
            CoverCols[nDivs] |= ((word)1 << nRows);
            nRows++;
        }
        else
        {
            if ( p->pPars->fVeryVerbose )
            {
                printf( "Node %d:  UNSAT.   ", Pivot );
                Extra_PrintBinary( stdout, (unsigned *)pTruth, 1 << Vec_IntSize(p->vDivSet) ), printf( "\n" );
            }
            p->nLuts[1]++;
            RetValue = 1;
            break;
        }
    }
    return RetValue;
}